

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_math.c
# Opt level: O1

float swap_median(float *arr,int n)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int iVar4;
  float *pfVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  float t;
  float fVar13;
  float t_144;
  
  switch(n - 3U >> 1 | (uint)((n - 3U & 1) != 0) << 0x1f) {
  case 0:
    fVar13 = *arr;
    if (arr[1] < fVar13) {
      *arr = arr[1];
      arr[1] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[2] < fVar13) {
      arr[1] = arr[2];
      arr[2] = fVar13;
    }
    pfVar5 = arr + 1;
    fVar13 = *arr;
    if (arr[1] < fVar13) {
      *arr = arr[1];
      arr[1] = fVar13;
    }
    break;
  case 1:
    fVar13 = *arr;
    if (arr[1] < fVar13) {
      *arr = arr[1];
      arr[1] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[4] < fVar13) {
      arr[3] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = *arr;
    if (arr[3] < fVar13) {
      *arr = arr[3];
      arr[3] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[4] < fVar13) {
      arr[1] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[2] < fVar13) {
      arr[1] = arr[2];
      arr[2] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[3] < fVar13) {
      arr[2] = arr[3];
      arr[3] = fVar13;
    }
    pfVar5 = arr + 2;
    fVar13 = arr[1];
    if (fVar13 <= arr[2]) break;
    arr[1] = arr[2];
    goto LAB_001117e9;
  case 2:
    fVar13 = *arr;
    if (arr[5] < fVar13) {
      *arr = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = *arr;
    if (arr[3] < fVar13) {
      *arr = arr[3];
      arr[3] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[6] < fVar13) {
      arr[1] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[4] < fVar13) {
      arr[2] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = *arr;
    if (arr[1] < fVar13) {
      *arr = arr[1];
      arr[1] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[5] < fVar13) {
      arr[3] = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[6] < fVar13) {
      arr[2] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[3] < fVar13) {
      arr[2] = arr[3];
      arr[3] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[6] < fVar13) {
      arr[3] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[5] < fVar13) {
      arr[4] = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[4] < fVar13) {
      arr[1] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[3] < fVar13) {
      arr[1] = arr[3];
      arr[3] = fVar13;
    }
    pfVar5 = arr + 3;
    fVar13 = arr[3];
    if (arr[4] < fVar13) {
      arr[3] = arr[4];
      arr[4] = fVar13;
    }
    break;
  case 3:
    fVar13 = arr[1];
    if (arr[2] < fVar13) {
      arr[1] = arr[2];
      arr[2] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[5] < fVar13) {
      arr[4] = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[8] < fVar13) {
      arr[7] = arr[8];
      arr[8] = fVar13;
    }
    fVar13 = *arr;
    if (arr[1] < fVar13) {
      *arr = arr[1];
      arr[1] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[4] < fVar13) {
      arr[3] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[7] < fVar13) {
      arr[6] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[2] < fVar13) {
      arr[1] = arr[2];
      arr[2] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[5] < fVar13) {
      arr[4] = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[8] < fVar13) {
      arr[7] = arr[8];
      arr[8] = fVar13;
    }
    fVar13 = *arr;
    if (arr[3] < fVar13) {
      *arr = arr[3];
      arr[3] = fVar13;
    }
    fVar13 = arr[5];
    if (arr[8] < fVar13) {
      arr[5] = arr[8];
      arr[8] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[7] < fVar13) {
      arr[4] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[6] < fVar13) {
      arr[3] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[4] < fVar13) {
      arr[1] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[5] < fVar13) {
      arr[2] = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[7] < fVar13) {
      arr[4] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[2] < fVar13) {
      arr[4] = arr[2];
      arr[2] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[4] < fVar13) {
      arr[6] = arr[4];
      arr[4] = fVar13;
    }
    pfVar5 = arr + 4;
    fVar13 = arr[4];
    if (fVar13 <= arr[2]) break;
    arr[4] = arr[2];
LAB_001117e9:
    arr[2] = fVar13;
    break;
  default:
    uVar6 = n - 1;
    iVar4 = (n - ((int)uVar6 >> 0x1f)) + -1 >> 1;
    if (1 < n) {
      iVar7 = 0;
      do {
        uVar11 = iVar7 + 1;
        uVar8 = (ulong)uVar11;
        if (uVar6 == uVar11) {
          fVar13 = arr[iVar7];
          if (arr[(int)uVar6] < fVar13) {
            arr[iVar7] = arr[(int)uVar6];
            arr[(int)uVar6] = fVar13;
          }
          break;
        }
        iVar9 = (int)(iVar7 + uVar6) / 2;
        fVar13 = arr[iVar9];
        if (arr[(int)uVar6] < fVar13) {
          arr[iVar9] = arr[(int)uVar6];
          arr[(int)uVar6] = fVar13;
        }
        fVar13 = arr[iVar7];
        if (arr[(int)uVar6] < fVar13) {
          arr[iVar7] = arr[(int)uVar6];
          arr[(int)uVar6] = fVar13;
        }
        fVar13 = arr[iVar9];
        if (arr[iVar7] < fVar13) {
          arr[iVar9] = arr[iVar7];
          arr[iVar7] = fVar13;
        }
        fVar13 = arr[iVar9];
        arr[iVar9] = arr[(int)uVar11];
        arr[(int)uVar11] = fVar13;
        uVar11 = uVar6;
        while( true ) {
          fVar13 = arr[iVar7];
          uVar8 = (ulong)(int)uVar8;
          do {
            fVar1 = arr[uVar8 + 1];
            uVar8 = uVar8 + 1;
          } while (fVar1 < fVar13);
          lVar3 = (long)(int)uVar11 + 1;
          do {
            uVar10 = uVar11;
            lVar12 = lVar3;
            fVar2 = arr[lVar12 + -2];
            uVar11 = uVar10 - 1;
            lVar3 = lVar12 + -1;
          } while (fVar13 < fVar2);
          if (lVar12 + -1 <= (long)uVar8) break;
          arr[uVar8] = fVar2;
          arr[lVar12 + -2] = fVar1;
        }
        arr[iVar7] = fVar2;
        arr[lVar12 + -2] = fVar13;
        if ((int)uVar11 <= iVar4) {
          iVar7 = (int)uVar8;
        }
        if (iVar4 < (int)uVar10) {
          uVar6 = uVar10 - 2;
        }
      } while (iVar7 < (int)uVar6);
    }
    pfVar5 = arr + iVar4;
    break;
  case 0xb:
    fVar13 = *arr;
    if (arr[1] < fVar13) {
      *arr = arr[1];
      arr[1] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[4] < fVar13) {
      arr[3] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[4] < fVar13) {
      arr[2] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[3] < fVar13) {
      arr[2] = arr[3];
      arr[3] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[7] < fVar13) {
      arr[6] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[5];
    if (arr[7] < fVar13) {
      arr[5] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[5];
    if (arr[6] < fVar13) {
      arr[5] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = arr[9];
    if (arr[10] < fVar13) {
      arr[9] = arr[10];
      arr[10] = fVar13;
    }
    fVar13 = arr[8];
    if (arr[10] < fVar13) {
      arr[8] = arr[10];
      arr[10] = fVar13;
    }
    fVar13 = arr[8];
    if (arr[9] < fVar13) {
      arr[8] = arr[9];
      arr[9] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0xd] < fVar13) {
      arr[0xc] = arr[0xd];
      arr[0xd] = fVar13;
    }
    fVar13 = arr[0xb];
    if (arr[0xd] < fVar13) {
      arr[0xb] = arr[0xd];
      arr[0xd] = fVar13;
    }
    fVar13 = arr[0xb];
    if (arr[0xc] < fVar13) {
      arr[0xb] = arr[0xc];
      arr[0xc] = fVar13;
    }
    fVar13 = arr[0xf];
    if (arr[0x10] < fVar13) {
      arr[0xf] = arr[0x10];
      arr[0x10] = fVar13;
    }
    fVar13 = arr[0xe];
    if (arr[0x10] < fVar13) {
      arr[0xe] = arr[0x10];
      arr[0x10] = fVar13;
    }
    fVar13 = arr[0xe];
    if (arr[0xf] < fVar13) {
      arr[0xe] = arr[0xf];
      arr[0xf] = fVar13;
    }
    fVar13 = arr[0x12];
    if (arr[0x13] < fVar13) {
      arr[0x12] = arr[0x13];
      arr[0x13] = fVar13;
    }
    fVar13 = arr[0x11];
    if (arr[0x13] < fVar13) {
      arr[0x11] = arr[0x13];
      arr[0x13] = fVar13;
    }
    fVar13 = arr[0x11];
    if (arr[0x12] < fVar13) {
      arr[0x11] = arr[0x12];
      arr[0x12] = fVar13;
    }
    fVar13 = arr[0x15];
    if (arr[0x16] < fVar13) {
      arr[0x15] = arr[0x16];
      arr[0x16] = fVar13;
    }
    fVar13 = arr[0x14];
    if (arr[0x16] < fVar13) {
      arr[0x14] = arr[0x16];
      arr[0x16] = fVar13;
    }
    fVar13 = arr[0x14];
    if (arr[0x15] < fVar13) {
      arr[0x14] = arr[0x15];
      arr[0x15] = fVar13;
    }
    fVar13 = arr[0x17];
    if (arr[0x18] < fVar13) {
      arr[0x17] = arr[0x18];
      arr[0x18] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[5] < fVar13) {
      arr[2] = arr[5];
      arr[5] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[6] < fVar13) {
      arr[3] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = *arr;
    if (arr[6] < fVar13) {
      *arr = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = *arr;
    if (arr[3] < fVar13) {
      *arr = arr[3];
      arr[3] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[7] < fVar13) {
      arr[4] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[7] < fVar13) {
      arr[1] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[4] < fVar13) {
      arr[1] = arr[4];
      arr[4] = fVar13;
    }
    fVar13 = arr[0xb];
    if (arr[0xe] < fVar13) {
      arr[0xb] = arr[0xe];
      arr[0xe] = fVar13;
    }
    fVar13 = arr[8];
    if (arr[0xe] < fVar13) {
      arr[8] = arr[0xe];
      arr[0xe] = fVar13;
    }
    fVar13 = arr[8];
    if (arr[0xb] < fVar13) {
      arr[8] = arr[0xb];
      arr[0xb] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0xf] < fVar13) {
      arr[0xc] = arr[0xf];
      arr[0xf] = fVar13;
    }
    fVar13 = arr[9];
    if (arr[0xf] < fVar13) {
      arr[9] = arr[0xf];
      arr[0xf] = fVar13;
    }
    fVar13 = arr[9];
    if (arr[0xc] < fVar13) {
      arr[9] = arr[0xc];
      arr[0xc] = fVar13;
    }
    fVar13 = arr[0xd];
    if (arr[0x10] < fVar13) {
      arr[0xd] = arr[0x10];
      arr[0x10] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0x10] < fVar13) {
      arr[10] = arr[0x10];
      arr[0x10] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0xd] < fVar13) {
      arr[10] = arr[0xd];
      arr[0xd] = fVar13;
    }
    fVar13 = arr[0x14];
    if (arr[0x17] < fVar13) {
      arr[0x14] = arr[0x17];
      arr[0x17] = fVar13;
    }
    fVar13 = arr[0x11];
    if (arr[0x17] < fVar13) {
      arr[0x11] = arr[0x17];
      arr[0x17] = fVar13;
    }
    fVar13 = arr[0x11];
    if (arr[0x14] < fVar13) {
      arr[0x11] = arr[0x14];
      arr[0x14] = fVar13;
    }
    fVar13 = arr[0x15];
    if (arr[0x18] < fVar13) {
      arr[0x15] = arr[0x18];
      arr[0x18] = fVar13;
    }
    fVar13 = arr[0x12];
    if (arr[0x18] < fVar13) {
      arr[0x12] = arr[0x18];
      arr[0x18] = fVar13;
    }
    fVar13 = arr[0x12];
    if (arr[0x15] < fVar13) {
      arr[0x12] = arr[0x15];
      arr[0x15] = fVar13;
    }
    fVar13 = arr[0x13];
    if (arr[0x16] < fVar13) {
      arr[0x13] = arr[0x16];
      arr[0x16] = fVar13;
    }
    fVar13 = arr[8];
    if (arr[0x11] < fVar13) {
      arr[8] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[9];
    if (arr[0x12] < fVar13) {
      arr[9] = arr[0x12];
      arr[0x12] = fVar13;
    }
    fVar13 = *arr;
    if (arr[0x12] < fVar13) {
      *arr = arr[0x12];
      arr[0x12] = fVar13;
    }
    fVar13 = *arr;
    if (arr[9] < fVar13) {
      *arr = arr[9];
      arr[9] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0x13] < fVar13) {
      arr[10] = arr[0x13];
      arr[0x13] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[0x13] < fVar13) {
      arr[1] = arr[0x13];
      arr[0x13] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[10] < fVar13) {
      arr[1] = arr[10];
      arr[10] = fVar13;
    }
    fVar13 = arr[0xb];
    if (arr[0x14] < fVar13) {
      arr[0xb] = arr[0x14];
      arr[0x14] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[0x14] < fVar13) {
      arr[2] = arr[0x14];
      arr[0x14] = fVar13;
    }
    fVar13 = arr[2];
    if (arr[0xb] < fVar13) {
      arr[2] = arr[0xb];
      arr[0xb] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0x15] < fVar13) {
      arr[0xc] = arr[0x15];
      arr[0x15] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[0x15] < fVar13) {
      arr[3] = arr[0x15];
      arr[0x15] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[0xc] < fVar13) {
      arr[3] = arr[0xc];
      arr[0xc] = fVar13;
    }
    fVar13 = arr[0xd];
    if (arr[0x16] < fVar13) {
      arr[0xd] = arr[0x16];
      arr[0x16] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[0x16] < fVar13) {
      arr[4] = arr[0x16];
      arr[0x16] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[0xd] < fVar13) {
      arr[4] = arr[0xd];
      arr[0xd] = fVar13;
    }
    fVar13 = arr[0xe];
    if (arr[0x17] < fVar13) {
      arr[0xe] = arr[0x17];
      arr[0x17] = fVar13;
    }
    fVar13 = arr[5];
    if (arr[0x17] < fVar13) {
      arr[5] = arr[0x17];
      arr[0x17] = fVar13;
    }
    fVar13 = arr[5];
    if (arr[0xe] < fVar13) {
      arr[5] = arr[0xe];
      arr[0xe] = fVar13;
    }
    fVar13 = arr[0xf];
    if (arr[0x18] < fVar13) {
      arr[0xf] = arr[0x18];
      arr[0x18] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[0x18] < fVar13) {
      arr[6] = arr[0x18];
      arr[0x18] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[0xf] < fVar13) {
      arr[6] = arr[0xf];
      arr[0xf] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0x10] < fVar13) {
      arr[7] = arr[0x10];
      arr[0x10] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0x13] < fVar13) {
      arr[7] = arr[0x13];
      arr[0x13] = fVar13;
    }
    fVar13 = arr[0xd];
    if (arr[0x15] < fVar13) {
      arr[0xd] = arr[0x15];
      arr[0x15] = fVar13;
    }
    fVar13 = arr[0xf];
    if (arr[0x17] < fVar13) {
      arr[0xf] = arr[0x17];
      arr[0x17] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0xd] < fVar13) {
      arr[7] = arr[0xd];
      arr[0xd] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0xf] < fVar13) {
      arr[7] = arr[0xf];
      arr[0xf] = fVar13;
    }
    fVar13 = arr[1];
    if (arr[9] < fVar13) {
      arr[1] = arr[9];
      arr[9] = fVar13;
    }
    fVar13 = arr[3];
    if (arr[0xb] < fVar13) {
      arr[3] = arr[0xb];
      arr[0xb] = fVar13;
    }
    fVar13 = arr[5];
    if (arr[0x11] < fVar13) {
      arr[5] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[0xb];
    if (arr[0x11] < fVar13) {
      arr[0xb] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[9];
    if (arr[0x11] < fVar13) {
      arr[9] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[10] < fVar13) {
      arr[4] = arr[10];
      arr[10] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[0xc] < fVar13) {
      arr[6] = arr[0xc];
      arr[0xc] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0xe] < fVar13) {
      arr[7] = arr[0xe];
      arr[0xe] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[6] < fVar13) {
      arr[4] = arr[6];
      arr[6] = fVar13;
    }
    fVar13 = arr[4];
    if (arr[7] < fVar13) {
      arr[4] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0xe] < fVar13) {
      arr[0xc] = arr[0xe];
      arr[0xe] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0xe] < fVar13) {
      arr[10] = arr[0xe];
      arr[0xe] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[7] < fVar13) {
      arr[6] = arr[7];
      arr[7] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0xc] < fVar13) {
      arr[10] = arr[0xc];
      arr[0xc] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[10] < fVar13) {
      arr[6] = arr[10];
      arr[10] = fVar13;
    }
    fVar13 = arr[6];
    if (arr[0x11] < fVar13) {
      arr[6] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0x11] < fVar13) {
      arr[0xc] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0x11] < fVar13) {
      arr[7] = arr[0x11];
      arr[0x11] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[10] < fVar13) {
      arr[7] = arr[10];
      arr[10] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0x12] < fVar13) {
      arr[0xc] = arr[0x12];
      arr[0x12] = fVar13;
    }
    fVar13 = arr[7];
    if (arr[0xc] < fVar13) {
      arr[7] = arr[0xc];
      arr[0xc] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0x12] < fVar13) {
      arr[10] = arr[0x12];
      arr[0x12] = fVar13;
    }
    fVar13 = arr[0xc];
    if (arr[0x14] < fVar13) {
      arr[0xc] = arr[0x14];
      arr[0x14] = fVar13;
    }
    fVar13 = arr[10];
    if (arr[0x14] < fVar13) {
      arr[10] = arr[0x14];
      arr[0x14] = fVar13;
    }
    pfVar5 = arr + 0xc;
    fVar13 = arr[10];
    if (arr[0xc] < fVar13) {
      arr[10] = arr[0xc];
      arr[0xc] = fVar13;
    }
  }
  return *pfVar5;
}

Assistant:

elem_type swap_median(elem_type *arr, int n) {

    /*
     * The following routines have been built from knowledge gathered
     * around the Web. I am not aware of any copyright problem with
     * them, so use it as you want.
     * N. Devillard - 1998
     */
    switch (n) {
    case 3:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[0], arr[1]);
            return arr[1];
        }
    case 5:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[1], arr[2]);
            return arr[2];
        }
    case 7:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[5]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[1], arr[6]);
            PIX_SORT(arr[2], arr[4]);
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[5]);
            PIX_SORT(arr[2], arr[6]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[1], arr[3]);
            PIX_SORT(arr[3], arr[4]);
            return arr[3];
        }
    case 9:
        /* Formula from: XILINX XCELL magazine, vol. 23 by John L. Smith
           The input array is modified in the process.
           The result array is guaranteed to contain the median value
           in middle position, but other elements are NOT sorted. */
        {
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[7], arr[8]);
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[7], arr[8]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[5], arr[8]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[2], arr[5]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[4], arr[2]);
            PIX_SORT(arr[6], arr[4]);
            PIX_SORT(arr[4], arr[2]);
            return arr[4];
        }
    case 25:
        /* Code taken from Graphic Gems. */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[2], arr[4]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[5], arr[7]);
            PIX_SORT(arr[5], arr[6]);
            PIX_SORT(arr[9], arr[10]);
            PIX_SORT(arr[8], arr[10]);
            PIX_SORT(arr[8], arr[9]);
            PIX_SORT(arr[12], arr[13]);
            PIX_SORT(arr[11], arr[13]);
            PIX_SORT(arr[11], arr[12]);
            PIX_SORT(arr[15], arr[16]);
            PIX_SORT(arr[14], arr[16]);
            PIX_SORT(arr[14], arr[15]);
            PIX_SORT(arr[18], arr[19]);
            PIX_SORT(arr[17], arr[19]);
            PIX_SORT(arr[17], arr[18]);
            PIX_SORT(arr[21], arr[22]);
            PIX_SORT(arr[20], arr[22]);
            PIX_SORT(arr[20], arr[21]);
            PIX_SORT(arr[23], arr[24]);
            PIX_SORT(arr[2], arr[5]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[0], arr[6]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[1], arr[7]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[11], arr[14]);
            PIX_SORT(arr[8], arr[14]);
            PIX_SORT(arr[8], arr[11]);
            PIX_SORT(arr[12], arr[15]);
            PIX_SORT(arr[9], arr[15]);
            PIX_SORT(arr[9], arr[12]);
            PIX_SORT(arr[13], arr[16]);
            PIX_SORT(arr[10], arr[16]);
            PIX_SORT(arr[10], arr[13]);
            PIX_SORT(arr[20], arr[23]);
            PIX_SORT(arr[17], arr[23]);
            PIX_SORT(arr[17], arr[20]);
            PIX_SORT(arr[21], arr[24]);
            PIX_SORT(arr[18], arr[24]);
            PIX_SORT(arr[18], arr[21]);
            PIX_SORT(arr[19], arr[22]);
            PIX_SORT(arr[8], arr[17]);
            PIX_SORT(arr[9], arr[18]);
            PIX_SORT(arr[0], arr[18]);
            PIX_SORT(arr[0], arr[9]);
            PIX_SORT(arr[10], arr[19]);
            PIX_SORT(arr[1], arr[19]);
            PIX_SORT(arr[1], arr[10]);
            PIX_SORT(arr[11], arr[20]);
            PIX_SORT(arr[2], arr[20]);
            PIX_SORT(arr[2], arr[11]);
            PIX_SORT(arr[12], arr[21]);
            PIX_SORT(arr[3], arr[21]);
            PIX_SORT(arr[3], arr[12]);
            PIX_SORT(arr[13], arr[22]);
            PIX_SORT(arr[4], arr[22]);
            PIX_SORT(arr[4], arr[13]);
            PIX_SORT(arr[14], arr[23]);
            PIX_SORT(arr[5], arr[23]);
            PIX_SORT(arr[5], arr[14]);
            PIX_SORT(arr[15], arr[24]);
            PIX_SORT(arr[6], arr[24]);
            PIX_SORT(arr[6], arr[15]);
            PIX_SORT(arr[7], arr[16]);
            PIX_SORT(arr[7], arr[19]);
            PIX_SORT(arr[13], arr[21]);
            PIX_SORT(arr[15], arr[23]);
            PIX_SORT(arr[7], arr[13]);
            PIX_SORT(arr[7], arr[15]);
            PIX_SORT(arr[1], arr[9]);
            PIX_SORT(arr[3], arr[11]);
            PIX_SORT(arr[5], arr[17]);
            PIX_SORT(arr[11], arr[17]);
            PIX_SORT(arr[9], arr[17]);
            PIX_SORT(arr[4], arr[10]);
            PIX_SORT(arr[6], arr[12]);
            PIX_SORT(arr[7], arr[14]);
            PIX_SORT(arr[4], arr[6]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[12], arr[14]);
            PIX_SORT(arr[10], arr[14]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[10], arr[12]);
            PIX_SORT(arr[6], arr[10]);
            PIX_SORT(arr[6], arr[17]);
            PIX_SORT(arr[12], arr[17]);
            PIX_SORT(arr[7], arr[17]);
            PIX_SORT(arr[7], arr[10]);
            PIX_SORT(arr[12], arr[18]);
            PIX_SORT(arr[7], arr[12]);
            PIX_SORT(arr[10], arr[18]);
            PIX_SORT(arr[12], arr[20]);
            PIX_SORT(arr[10], arr[20]);
            PIX_SORT(arr[10], arr[12]);
            return arr[12];
        }
    }

    int low = 0, high = n - 1;
    int median, middle, ll, hh;

    median = (low + high) / 2;
    for (;;) {
        if (high <= low)        /* One element only */
            return arr[median];

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]);
            return arr[median];
        }

        /* Find median of low, middle and high items; swap into position low */
        middle = (low + high) / 2;
        if (arr[middle] > arr[high])
            ELEM_SWAP(arr[middle], arr[high]);
        if (arr[low] > arr[high])
            ELEM_SWAP(arr[low], arr[high]);
        if (arr[middle] > arr[low])
            ELEM_SWAP(arr[middle], arr[low]);

        /* Swap low item (now in position middle) into position (low+1) */
        ELEM_SWAP(arr[middle], arr[low + 1]);

        /* Nibble from each end towards middle, swapping items when stuck */
        ll = low + 1;
        hh = high;
        for (;;) {
            do
                ++ll;
            while (arr[low] > arr[ll]);
            do
                --hh;
            while (arr[hh] > arr[low]);

            if (hh < ll)
                break;

            ELEM_SWAP(arr[ll], arr[hh]);
        }

        /* Swap middle item (in position low) back into correct position */
        ELEM_SWAP(arr[low], arr[hh]);

        /* Re-set active partition */
        if (hh <= median)
            low = ll;
        if (hh >= median)
            high = hh - 1;
    }
}